

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_striped_avx2_256_8.c
# Opt level: O2

parasail_result_t *
parasail_sg_flags_striped_profile_avx2_256_8
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  __m256i alVar1;
  char cVar2;
  uint uVar3;
  void *pvVar4;
  parasail_matrix_t *ppVar5;
  ulong uVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  uint uVar10;
  char cVar11;
  uint uVar12;
  int iVar13;
  parasail_result_t *ppVar14;
  __m256i *ptr;
  __m256i *palVar15;
  __m256i *ptr_00;
  int8_t *ptr_01;
  int iVar16;
  uint uVar17;
  char *pcVar18;
  int iVar19;
  uint uVar20;
  long lVar21;
  __m256i *palVar22;
  int iVar23;
  int iVar24;
  char *__format;
  int8_t iVar25;
  uint uVar26;
  long lVar27;
  ulong uVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  char cVar32;
  int iVar33;
  ulong uVar34;
  long lVar35;
  undefined1 uVar36;
  undefined1 auVar37 [16];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  __m256i_8_t e;
  __m256i_8_t h;
  longlong local_a0;
  longlong lStack_98;
  longlong lStack_90;
  longlong lStack_88;
  longlong local_80;
  longlong lStack_78;
  longlong lStack_70;
  longlong lStack_68;
  undefined1 auVar38 [32];
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar18 = "profile";
  }
  else {
    pvVar4 = (profile->profile8).score;
    if (pvVar4 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar18 = "profile->profile8.score";
    }
    else {
      ppVar5 = profile->matrix;
      if (ppVar5 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar18 = "profile->matrix";
      }
      else {
        uVar3 = profile->s1Len;
        if ((int)uVar3 < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar18 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar18 = "s2";
        }
        else if (s2Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar18 = "s2Len";
        }
        else if (open < 0) {
          __format = "%s: %s must be >= 0\n";
          pcVar18 = "open";
        }
        else {
          if (-1 < gap) {
            uVar12 = uVar3 - 1;
            uVar34 = (ulong)uVar3 + 0x1f >> 5;
            uVar6 = (ulong)uVar12 % uVar34;
            iVar13 = ppVar5->min;
            iVar23 = -open;
            uVar26 = (uint)(byte)-(char)iVar13;
            if (iVar13 != iVar23 && SBORROW4(iVar13,iVar23) == iVar13 + open < 0) {
              uVar26 = open;
            }
            cVar11 = '~' - (char)ppVar5->max;
            ppVar14 = parasail_result_new();
            if (ppVar14 != (parasail_result_t *)0x0) {
              ppVar14->flag =
                   (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe
                   | (uint)(s2_end != 0) << 0xf | ppVar14->flag | 0x20100802;
              ptr = parasail_memalign___m256i(0x20,uVar34);
              palVar15 = parasail_memalign___m256i(0x20,uVar34);
              ptr_00 = parasail_memalign___m256i(0x20,uVar34);
              ptr_01 = parasail_memalign_int8_t(0x20,(ulong)(s2Len + 1));
              if ((ptr_01 != (int8_t *)0x0 && ptr_00 != (__m256i *)0x0) &&
                  (palVar15 != (__m256i *)0x0 && ptr != (__m256i *)0x0)) {
                iVar13 = s2Len + -1;
                iVar16 = 0x1f - (int)(uVar12 / uVar34);
                uVar36 = (undefined1)open;
                auVar43[1] = uVar36;
                auVar43[0] = uVar36;
                auVar43[2] = uVar36;
                auVar43[3] = uVar36;
                auVar43[4] = uVar36;
                auVar43[5] = uVar36;
                auVar43[6] = uVar36;
                auVar43[7] = uVar36;
                auVar43[8] = uVar36;
                auVar43[9] = uVar36;
                auVar43[10] = uVar36;
                auVar43[0xb] = uVar36;
                auVar43[0xc] = uVar36;
                auVar43[0xd] = uVar36;
                auVar43[0xe] = uVar36;
                auVar43[0xf] = uVar36;
                auVar43[0x10] = uVar36;
                auVar43[0x11] = uVar36;
                auVar43[0x12] = uVar36;
                auVar43[0x13] = uVar36;
                auVar43[0x14] = uVar36;
                auVar43[0x15] = uVar36;
                auVar43[0x16] = uVar36;
                auVar43[0x17] = uVar36;
                auVar43[0x18] = uVar36;
                auVar43[0x19] = uVar36;
                auVar43[0x1a] = uVar36;
                auVar43[0x1b] = uVar36;
                auVar43[0x1c] = uVar36;
                auVar43[0x1d] = uVar36;
                auVar43[0x1e] = uVar36;
                auVar43[0x1f] = uVar36;
                uVar36 = (undefined1)gap;
                auVar44[1] = uVar36;
                auVar44[0] = uVar36;
                auVar44[2] = uVar36;
                auVar44[3] = uVar36;
                auVar44[4] = uVar36;
                auVar44[5] = uVar36;
                auVar44[6] = uVar36;
                auVar44[7] = uVar36;
                auVar44[8] = uVar36;
                auVar44[9] = uVar36;
                auVar44[10] = uVar36;
                auVar44[0xb] = uVar36;
                auVar44[0xc] = uVar36;
                auVar44[0xd] = uVar36;
                auVar44[0xe] = uVar36;
                auVar44[0xf] = uVar36;
                auVar44[0x10] = uVar36;
                auVar44[0x11] = uVar36;
                auVar44[0x12] = uVar36;
                auVar44[0x13] = uVar36;
                auVar44[0x14] = uVar36;
                auVar44[0x15] = uVar36;
                auVar44[0x16] = uVar36;
                auVar44[0x17] = uVar36;
                auVar44[0x18] = uVar36;
                auVar44[0x19] = uVar36;
                auVar44[0x1a] = uVar36;
                auVar44[0x1b] = uVar36;
                auVar44[0x1c] = uVar36;
                auVar44[0x1d] = uVar36;
                auVar44[0x1e] = uVar36;
                auVar44[0x1f] = uVar36;
                cVar32 = (char)uVar26 + -0x7f;
                auVar37[1] = cVar32;
                auVar37[0] = cVar32;
                auVar37[2] = cVar32;
                auVar37[3] = cVar32;
                auVar37[4] = cVar32;
                auVar37[5] = cVar32;
                auVar37[6] = cVar32;
                auVar37[7] = cVar32;
                auVar37[8] = cVar32;
                auVar37[9] = cVar32;
                auVar37[10] = cVar32;
                auVar37[0xb] = cVar32;
                auVar37[0xc] = cVar32;
                auVar37[0xd] = cVar32;
                auVar37[0xe] = cVar32;
                auVar37[0xf] = cVar32;
                auVar38[0x10] = cVar32;
                auVar38._0_16_ = auVar37;
                auVar38[0x11] = cVar32;
                auVar38[0x12] = cVar32;
                auVar38[0x13] = cVar32;
                auVar38[0x14] = cVar32;
                auVar38[0x15] = cVar32;
                auVar38[0x16] = cVar32;
                auVar38[0x17] = cVar32;
                auVar38[0x18] = cVar32;
                auVar38[0x19] = cVar32;
                auVar38[0x1a] = cVar32;
                auVar38[0x1b] = cVar32;
                auVar38[0x1c] = cVar32;
                auVar38[0x1d] = cVar32;
                auVar38[0x1e] = cVar32;
                auVar38[0x1f] = cVar32;
                auVar39[1] = cVar11;
                auVar39[0] = cVar11;
                auVar39[2] = cVar11;
                auVar39[3] = cVar11;
                auVar39[4] = cVar11;
                auVar39[5] = cVar11;
                auVar39[6] = cVar11;
                auVar39[7] = cVar11;
                auVar39[8] = cVar11;
                auVar39[9] = cVar11;
                auVar39[10] = cVar11;
                auVar39[0xb] = cVar11;
                auVar39[0xc] = cVar11;
                auVar39[0xd] = cVar11;
                auVar39[0xe] = cVar11;
                auVar39[0xf] = cVar11;
                auVar39[0x10] = cVar11;
                auVar39[0x11] = cVar11;
                auVar39[0x12] = cVar11;
                auVar39[0x13] = cVar11;
                auVar39[0x14] = cVar11;
                auVar39[0x15] = cVar11;
                auVar39[0x16] = cVar11;
                auVar39[0x17] = cVar11;
                auVar39[0x18] = cVar11;
                auVar39[0x19] = cVar11;
                auVar39[0x1a] = cVar11;
                auVar39[0x1b] = cVar11;
                auVar39[0x1c] = cVar11;
                auVar39[0x1d] = cVar11;
                auVar39[0x1e] = cVar11;
                auVar39[0x1f] = cVar11;
                auVar40[0] = (undefined1)iVar16;
                auVar40[1] = auVar40[0];
                auVar40[2] = auVar40[0];
                auVar40[3] = auVar40[0];
                auVar40[4] = auVar40[0];
                auVar40[5] = auVar40[0];
                auVar40[6] = auVar40[0];
                auVar40[7] = auVar40[0];
                auVar40[8] = auVar40[0];
                auVar40[9] = auVar40[0];
                auVar40[10] = auVar40[0];
                auVar40[0xb] = auVar40[0];
                auVar40[0xc] = auVar40[0];
                auVar40[0xd] = auVar40[0];
                auVar40[0xe] = auVar40[0];
                auVar40[0xf] = auVar40[0];
                auVar40[0x10] = auVar40[0];
                auVar40[0x11] = auVar40[0];
                auVar40[0x12] = auVar40[0];
                auVar40[0x13] = auVar40[0];
                auVar40[0x14] = auVar40[0];
                auVar40[0x15] = auVar40[0];
                auVar40[0x16] = auVar40[0];
                auVar40[0x17] = auVar40[0];
                auVar40[0x18] = auVar40[0];
                auVar40[0x19] = auVar40[0];
                auVar40[0x1a] = auVar40[0];
                auVar40[0x1b] = auVar40[0];
                auVar40[0x1c] = auVar40[0];
                auVar40[0x1d] = auVar40[0];
                auVar40[0x1e] = auVar40[0];
                auVar40[0x1f] = auVar40[0];
                lVar35 = (long)iVar23;
                for (uVar28 = 0; uVar28 != uVar34; uVar28 = uVar28 + 1) {
                  lVar27 = lVar35;
                  for (lVar21 = 0; lVar21 != 0x20; lVar21 = lVar21 + 1) {
                    lVar30 = lVar27;
                    if (s1_beg != 0) {
                      lVar30 = 0;
                    }
                    lVar29 = -0x80;
                    if (-0x80 < lVar30) {
                      lVar29 = lVar30;
                    }
                    lVar31 = lVar30 - (ulong)(uint)open;
                    if ((long)(lVar30 - (ulong)(uint)open) < -0x7f) {
                      lVar31 = -0x80;
                    }
                    *(char *)((long)&local_80 + lVar21) = (char)lVar29;
                    *(char *)((long)&local_a0 + lVar21) = (char)lVar31;
                    lVar27 = lVar27 - uVar34 * (uint)gap;
                  }
                  palVar22 = ptr + uVar28;
                  (*palVar22)[0] = local_80;
                  (*palVar22)[1] = lStack_78;
                  (*palVar22)[2] = lStack_70;
                  (*palVar22)[3] = lStack_68;
                  palVar22 = ptr_00 + uVar28;
                  (*palVar22)[0] = local_a0;
                  (*palVar22)[1] = lStack_98;
                  (*palVar22)[2] = lStack_90;
                  (*palVar22)[3] = lStack_88;
                  lVar35 = lVar35 - (ulong)(uint)gap;
                }
                *ptr_01 = '\0';
                iVar24 = iVar23;
                for (uVar28 = 1; s2Len + 1 != uVar28; uVar28 = uVar28 + 1) {
                  iVar25 = -0x80;
                  if (-0x80 < iVar24) {
                    iVar25 = (int8_t)iVar24;
                  }
                  if (s2_beg != 0) {
                    iVar25 = '\0';
                  }
                  ptr_01[uVar28] = iVar25;
                  iVar24 = iVar24 - gap;
                }
                uVar26 = (uint)uVar34;
                uVar28 = 0;
                auVar7 = vpcmpeqb_avx2(auVar40,_DAT_008a59e0);
                auVar42 = ZEXT3264(auVar39);
                auVar41 = ZEXT3264(auVar38);
                iVar24 = iVar13;
                auVar40 = auVar38;
                do {
                  palVar22 = palVar15;
                  if (uVar28 == (uint)s2Len) {
                    if (s2_end != 0) {
                      for (iVar23 = 0; iVar23 < iVar16; iVar23 = iVar23 + 1) {
                        auVar43 = vperm2i128_avx2(auVar40,auVar40,0x28);
                        auVar40 = vpalignr_avx2(auVar40,auVar43,0xf);
                      }
                      cVar32 = auVar40[0x17];
                    }
                    uVar17 = uVar12;
                    if (s1_end != 0) {
                      for (uVar34 = 0; (uVar26 & 0x3ffffff) << 5 != (uint)uVar34;
                          uVar34 = uVar34 + 1) {
                        uVar20 = ((uint)uVar34 & 0x1f) * uVar26 + ((uint)(uVar34 >> 5) & 0x7ffffff);
                        iVar23 = iVar24;
                        uVar10 = uVar17;
                        cVar11 = cVar32;
                        if (((int)uVar20 < (int)uVar3) &&
                           (cVar2 = *(char *)((long)*ptr + uVar34), iVar23 = iVar13, uVar10 = uVar20
                           , cVar11 = cVar2, cVar2 <= cVar32)) {
                          if ((int)uVar17 <= (int)uVar20) {
                            uVar20 = uVar17;
                          }
                          if (iVar24 != iVar13) {
                            uVar20 = uVar17;
                          }
                          iVar23 = iVar24;
                          uVar10 = uVar17;
                          cVar11 = cVar32;
                          if (cVar2 == cVar32) {
                            uVar10 = uVar20;
                          }
                        }
                        cVar32 = cVar11;
                        uVar17 = uVar10;
                        iVar24 = iVar23;
                      }
                    }
                    if (s2_end == 0 && s1_end == 0) {
                      alVar1 = ptr[uVar6];
                      for (iVar23 = 0; iVar23 < iVar16; iVar23 = iVar23 + 1) {
                        auVar40 = vperm2i128_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar1,
                                                  0x28);
                        alVar1 = (__m256i)vpalignr_avx2((undefined1  [32])alVar1,auVar40,0xf);
                      }
                      cVar32 = alVar1[2]._7_1_;
                      iVar24 = iVar13;
                      uVar17 = uVar12;
                    }
                    auVar38 = vpcmpgtb_avx2(auVar38,auVar42._0_32_);
                    auVar39 = vpcmpgtb_avx2(auVar41._0_32_,auVar39);
                    auVar38 = vpor_avx2(auVar39,auVar38);
                    if ((((((((((((((((((((((((((((((((auVar38 >> 7 & (undefined1  [32])0x1) !=
                                                      (undefined1  [32])0x0 ||
                                                     (auVar38 >> 0xf & (undefined1  [32])0x1) !=
                                                     (undefined1  [32])0x0) ||
                                                    (auVar38 >> 0x17 & (undefined1  [32])0x1) !=
                                                    (undefined1  [32])0x0) ||
                                                   (auVar38 >> 0x1f & (undefined1  [32])0x1) !=
                                                   (undefined1  [32])0x0) ||
                                                  (auVar38 >> 0x27 & (undefined1  [32])0x1) !=
                                                  (undefined1  [32])0x0) ||
                                                 (auVar38 >> 0x2f & (undefined1  [32])0x1) !=
                                                 (undefined1  [32])0x0) ||
                                                (auVar38 >> 0x37 & (undefined1  [32])0x1) !=
                                                (undefined1  [32])0x0) ||
                                               (auVar38 >> 0x3f & (undefined1  [32])0x1) !=
                                               (undefined1  [32])0x0) ||
                                              (auVar38 >> 0x47 & (undefined1  [32])0x1) !=
                                              (undefined1  [32])0x0) ||
                                             (auVar38 >> 0x4f & (undefined1  [32])0x1) !=
                                             (undefined1  [32])0x0) ||
                                            (auVar38 >> 0x57 & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0) ||
                                           (auVar38 >> 0x5f & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (auVar38 >> 0x67 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         (auVar38 >> 0x6f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar38 >> 0x77 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) || SUB321(auVar38 >> 0x7f,0) != '\0')
                                      || (auVar38 >> 0x87 & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                     (auVar38 >> 0x8f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar38 >> 0x97 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (auVar38 >> 0x9f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar38 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || (auVar38 >> 0xaf & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                (auVar38 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || SUB321(auVar38 >> 0xbf,0) != '\0') ||
                              (auVar38 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                             (auVar38 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar38 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           (auVar38 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar38 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar38 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar38 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        auVar38[0x1f] < '\0') {
                      *(byte *)&ppVar14->flag = (byte)ppVar14->flag | 0x40;
                      cVar32 = '\0';
                      iVar24 = 0;
                      uVar17 = 0;
                    }
                    ppVar14->score = (int)cVar32;
                    ppVar14->end_query = uVar17;
                    ppVar14->end_ref = iVar24;
                    parasail_free(ptr_01);
                    parasail_free(ptr_00);
                    parasail_free(palVar22);
                    parasail_free(ptr);
                    return ppVar14;
                  }
                  auVar45 = SUB3216(ptr[uVar26 - 1],0);
                  auVar46._0_16_ = ZEXT116(0) * auVar45 + ZEXT116(1) * auVar37;
                  auVar46._16_16_ = ZEXT116(0) * auVar38._16_16_ + ZEXT116(1) * auVar45;
                  auVar46 = vpalignr_avx2((undefined1  [32])ptr[uVar26 - 1],auVar46,0xf);
                  iVar33 = ppVar5->mapper[(byte)s2[uVar28]];
                  auVar45 = vpinsrb_avx(auVar46._0_16_,(uint)(byte)ptr_01[uVar28],0);
                  auVar46 = vpblendd_avx2(auVar46,ZEXT1632(auVar45),0xf);
                  auVar9 = auVar38;
                  for (lVar35 = 0; uVar34 * 0x20 != lVar35; lVar35 = lVar35 + 0x20) {
                    auVar47 = vpaddsb_avx2(auVar46,*(undefined1 (*) [32])
                                                    ((long)pvVar4 +
                                                    lVar35 + (long)(int)(iVar33 * uVar26) * 0x20));
                    auVar46 = *(undefined1 (*) [32])((long)*ptr_00 + lVar35);
                    auVar8 = vpmaxsb_avx2(auVar46,auVar9);
                    auVar47 = vpmaxsb_avx2(auVar47,auVar8);
                    *(undefined1 (*) [32])((long)*palVar22 + lVar35) = auVar47;
                    auVar8 = vpmaxsb_avx2(auVar41._0_32_,auVar47);
                    auVar41 = ZEXT3264(auVar8);
                    auVar8 = vpminsb_avx2(auVar42._0_32_,auVar46);
                    auVar8 = vpminsb_avx2(auVar8,auVar9);
                    auVar8 = vpminsb_avx2(auVar8,auVar47);
                    auVar42 = ZEXT3264(auVar8);
                    auVar47 = vpsubsb_avx2(auVar47,auVar43);
                    auVar46 = vpsubsb_avx2(auVar46,auVar44);
                    auVar46 = vpmaxsb_avx2(auVar46,auVar47);
                    *(undefined1 (*) [32])((long)*ptr_00 + lVar35) = auVar46;
                    auVar46 = vpsubsb_avx2(auVar9,auVar44);
                    auVar9 = vpmaxsb_avx2(auVar46,auVar47);
                    auVar46 = *(undefined1 (*) [32])((long)*ptr + lVar35);
                  }
                  for (iVar33 = 0; iVar33 != 0x20; iVar33 = iVar33 + 1) {
                    iVar19 = iVar23;
                    if (s2_beg == 0) {
                      iVar19 = ptr_01[uVar28 + 1] - open;
                    }
                    if (iVar19 < -0x7f) {
                      iVar19 = -0x80;
                    }
                    auVar47._0_16_ = ZEXT116(0) * auVar9._0_16_ + ZEXT116(1) * auVar37;
                    auVar47._16_16_ = ZEXT116(0) * auVar38._16_16_ + ZEXT116(1) * auVar9._0_16_;
                    auVar46 = vpalignr_avx2(auVar9,auVar47,0xf);
                    auVar45 = vpinsrb_avx(auVar46._0_16_,iVar19,0);
                    auVar9 = vpblendd_avx2(auVar46,ZEXT1632(auVar45),0xf);
                    lVar35 = 0;
                    while (uVar34 * 0x20 + 0x20 != lVar35 + 0x20) {
                      auVar46 = vpmaxsb_avx2(auVar9,*(undefined1 (*) [32])((long)*palVar22 + lVar35)
                                            );
                      *(undefined1 (*) [32])((long)*palVar22 + lVar35) = auVar46;
                      auVar47 = vpminsb_avx2(auVar42._0_32_,auVar46);
                      auVar42 = ZEXT3264(auVar47);
                      auVar47 = vpmaxsb_avx2(auVar41._0_32_,auVar46);
                      auVar41 = ZEXT3264(auVar47);
                      auVar46 = vpsubsb_avx2(auVar46,auVar43);
                      auVar9 = vpsubsb_avx2(auVar9,auVar44);
                      auVar46 = vpcmpgtb_avx2(auVar9,auVar46);
                      lVar35 = lVar35 + 0x20;
                      if ((((((((((((((((((((((((((((((((auVar46 >> 7 & (undefined1  [32])0x1) ==
                                                        (undefined1  [32])0x0 &&
                                                       (auVar46 >> 0xf & (undefined1  [32])0x1) ==
                                                       (undefined1  [32])0x0) &&
                                                      (auVar46 >> 0x17 & (undefined1  [32])0x1) ==
                                                      (undefined1  [32])0x0) &&
                                                     (auVar46 >> 0x1f & (undefined1  [32])0x1) ==
                                                     (undefined1  [32])0x0) &&
                                                    (auVar46 >> 0x27 & (undefined1  [32])0x1) ==
                                                    (undefined1  [32])0x0) &&
                                                   (auVar46 >> 0x2f & (undefined1  [32])0x1) ==
                                                   (undefined1  [32])0x0) &&
                                                  (auVar46 >> 0x37 & (undefined1  [32])0x1) ==
                                                  (undefined1  [32])0x0) &&
                                                 (auVar46 >> 0x3f & (undefined1  [32])0x1) ==
                                                 (undefined1  [32])0x0) &&
                                                (auVar46 >> 0x47 & (undefined1  [32])0x1) ==
                                                (undefined1  [32])0x0) &&
                                               (auVar46 >> 0x4f & (undefined1  [32])0x1) ==
                                               (undefined1  [32])0x0) &&
                                              (auVar46 >> 0x57 & (undefined1  [32])0x1) ==
                                              (undefined1  [32])0x0) &&
                                             (auVar46 >> 0x5f & (undefined1  [32])0x1) ==
                                             (undefined1  [32])0x0) &&
                                            (auVar46 >> 0x67 & (undefined1  [32])0x1) ==
                                            (undefined1  [32])0x0) &&
                                           (auVar46 >> 0x6f & (undefined1  [32])0x1) ==
                                           (undefined1  [32])0x0) &&
                                          (auVar46 >> 0x77 & (undefined1  [32])0x1) ==
                                          (undefined1  [32])0x0) &&
                                         SUB321(auVar46 >> 0x7f,0) == '\0') &&
                                        (auVar46 >> 0x87 & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0) &&
                                       (auVar46 >> 0x8f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                      (auVar46 >> 0x97 & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) &&
                                     (auVar46 >> 0x9f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar46 >> 0xa7 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                   (auVar46 >> 0xaf & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (auVar46 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                  ) && SUB321(auVar46 >> 0xbf,0) == '\0') &&
                                (auVar46 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && (auVar46 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               ) && (auVar46 >> 0xd7 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                             (auVar46 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar46 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           (auVar46 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar46 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          -1 < auVar46[0x1f]) goto LAB_0071dabe;
                    }
                  }
LAB_0071dabe:
                  auVar46 = vpcmpgtb_avx2((undefined1  [32])palVar22[uVar6],auVar40);
                  auVar46 = vpand_avx2(auVar46,auVar7);
                  auVar40 = vpmaxsb_avx2((undefined1  [32])palVar22[uVar6],auVar40);
                  if ((((((((((((((((((((((((((((((((auVar46 >> 7 & (undefined1  [32])0x1) !=
                                                    (undefined1  [32])0x0 ||
                                                   (auVar46 >> 0xf & (undefined1  [32])0x1) !=
                                                   (undefined1  [32])0x0) ||
                                                  (auVar46 >> 0x17 & (undefined1  [32])0x1) !=
                                                  (undefined1  [32])0x0) ||
                                                 (auVar46 >> 0x1f & (undefined1  [32])0x1) !=
                                                 (undefined1  [32])0x0) ||
                                                (auVar46 >> 0x27 & (undefined1  [32])0x1) !=
                                                (undefined1  [32])0x0) ||
                                               (auVar46 >> 0x2f & (undefined1  [32])0x1) !=
                                               (undefined1  [32])0x0) ||
                                              (auVar46 >> 0x37 & (undefined1  [32])0x1) !=
                                              (undefined1  [32])0x0) ||
                                             (auVar46 >> 0x3f & (undefined1  [32])0x1) !=
                                             (undefined1  [32])0x0) ||
                                            (auVar46 >> 0x47 & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0) ||
                                           (auVar46 >> 0x4f & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (auVar46 >> 0x57 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         (auVar46 >> 0x5f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar46 >> 0x67 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar46 >> 0x6f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar46 >> 0x77 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar46 >> 0x7f,0) != '\0')
                                    || (auVar46 >> 0x87 & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                   (auVar46 >> 0x8f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar46 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || (auVar46 >> 0x9f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                (auVar46 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || (auVar46 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar46 >> 0xb7 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar46 >> 0xbf,0) != '\0') ||
                            (auVar46 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           (auVar46 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar46 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar46 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar46 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar46 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar46 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      auVar46[0x1f] < '\0') {
                    iVar24 = (int)uVar28;
                  }
                  uVar28 = uVar28 + 1;
                  palVar15 = ptr;
                  ptr = palVar22;
                } while( true );
              }
            }
            return (parasail_result_t *)0x0;
          }
          __format = "%s: %s must be >= 0\n";
          pcVar18 = "gap";
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_sg_flags_striped_profile_avx2_256_8",pcVar18);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m256i* restrict vProfile = NULL;
    __m256i* restrict pvHStore = NULL;
    __m256i* restrict pvHLoad = NULL;
    __m256i* restrict pvE = NULL;
    int8_t* restrict boundary = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int8_t NEG_LIMIT = 0;
    int8_t POS_LIMIT = 0;
    int8_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vMaxH;
    __m256i vPosMask;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile8.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 32; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m256i*)profile->profile8.score;
    vGapO = _mm256_set1_epi8(open);
    vGapE = _mm256_set1_epi8(gap);
    NEG_LIMIT = (-open < matrix->min ? INT8_MIN + open : INT8_MIN - matrix->min) + 1;
    POS_LIMIT = INT8_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi8(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi8(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vPosMask = _mm256_cmpeq_epi8(_mm256_set1_epi8(position),
            _mm256_set_epi8(0,1,2,3,4,5,6,7,8,9,10,11,12,13,14,15,16,17,18,19,20,21,22,23,24,25,26,27,28,29,30,31));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_8 | PARASAIL_FLAG_LANES_32;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m256i(32, segLen);
    pvHLoad =  parasail_memalign___m256i(32, segLen);
    pvE      = parasail_memalign___m256i(32, segLen);
    boundary = parasail_memalign_int8_t(32, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m256i_8_t h;
            __m256i_8_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT8_MIN ? INT8_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT8_MIN ? INT8_MIN : tmp;
            }
            _mm256_store_si256(&pvHStore[index], h.m);
            _mm256_store_si256(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT8_MIN ? INT8_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        __m256i vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        __m256i vH = _mm256_slli_si256_rpl(pvHStore[segLen - 1], 1);

        /* Correct part of the vProfile */
        const __m256i* vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        __m256i* pv = pvHLoad;
        pvHLoad = pvHStore;
        pvHStore = pv;

        /* insert upper boundary condition */
        vH = _mm256_insert_epi8_rpl(vH, boundary[j], 0);

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm256_adds_epi8(vH, _mm256_load_si256(vP + i));
            vE = _mm256_load_si256(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm256_max_epi8(vH, vE);
            vH = _mm256_max_epi8(vH, vF);
            /* Save vH values. */
            _mm256_store_si256(pvHStore + i, vH);
            vSaturationCheckMax = _mm256_max_epi8(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm256_min_epi8(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm256_min_epi8(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm256_min_epi8(vSaturationCheckMin, vF);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif

            /* Update vE value. */
            vH = _mm256_subs_epi8(vH, vGapO);
            vE = _mm256_subs_epi8(vE, vGapE);
            vE = _mm256_max_epi8(vE, vH);
            _mm256_store_si256(pvE + i, vE);

            /* Update vF value. */
            vF = _mm256_subs_epi8(vF, vGapE);
            vF = _mm256_max_epi8(vF, vH);

            /* Load the next vH. */
            vH = _mm256_load_si256(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = s2_beg ? -open : (boundary[j+1]-open);
            int8_t tmp2 = tmp < INT8_MIN ? INT8_MIN : tmp;
            vF = _mm256_slli_si256_rpl(vF, 1);
            vF = _mm256_insert_epi8_rpl(vF, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm256_load_si256(pvHStore + i);
                vH = _mm256_max_epi8(vH,vF);
                _mm256_store_si256(pvHStore + i, vH);
                vSaturationCheckMin = _mm256_min_epi8(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm256_max_epi8(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
                arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vH = _mm256_subs_epi8(vH, vGapO);
                vF = _mm256_subs_epi8(vF, vGapE);
                if (! _mm256_movemask_epi8(_mm256_cmpgt_epi8(vF, vH))) goto end;
                /*vF = _mm256_max_epi8(vF, vH);*/
            }
        }
end:
        {
            /* extract vector containing last value from the column */
            __m256i vCompare;
            vH = _mm256_load_si256(pvHStore + offset);
            vCompare = _mm256_and_si256(vPosMask, _mm256_cmpgt_epi8(vH, vMaxH));
            vMaxH = _mm256_max_epi8(vH, vMaxH);
            if (_mm256_movemask_epi8(vCompare)) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 1);
            }
            result->rowcols->score_row[j] = (int8_t) _mm256_extract_epi8_rpl (vH, 31);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvHStore + i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm256_slli_si256_rpl(vMaxH, 1);
        }
        score = (int8_t) _mm256_extract_epi8_rpl(vMaxH, 31);
        end_query = s1Len-1;
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int8_t *t = (int8_t*)pvHStore;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
            }
        }
    }

    if (!s1_end && !s2_end) {
        /* extract last value from the last column */
        {
            __m256i vH = _mm256_load_si256(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 1);
            }
            score = (int8_t) _mm256_extract_epi8_rpl (vH, 31);
            end_ref = s2Len - 1;
            end_query = s1Len - 1;
        }
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi8_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi8(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}